

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::FinalizePending(void)

{
  void *pvVar1;
  ulong uVar2;
  Range *pRVar3;
  ExternTypeInfo *elementType;
  uint i;
  uint index;
  uint uVar4;
  
  for (index = 0; index < _DAT_00243efc; index = index + 1) {
    pRVar3 = FastVector<NULLC::Range,_false,_false>::operator[]
                       ((FastVector<NULLC::Range,_false,_false> *)&blocksToFinalize,index);
    pvVar1 = pRVar3->start;
    uVar2 = *(ulong *)((long)pvVar1 + 4);
    *(ulong *)((long)pvVar1 + 4) = uVar2 | 1;
    elementType = FastVector<ExternTypeInfo,_false,_false>::operator[]
                            ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                             (uint)(uVar2 >> 8) & 0xffffff);
    if ((*(byte *)((long)pvVar1 + 4) & 0x10) == 0) {
      GC::CheckVariable((char *)((long)pvVar1 + 0xc),elementType);
    }
    else {
      uVar4._0_1_ = elementType->defaultAlign;
      uVar4._1_1_ = elementType->typeFlags;
      uVar4._2_2_ = elementType->pointerCount;
      if ((byte)(undefined1)uVar4 < 5) {
        uVar4 = 4;
      }
      GC::CheckArrayElements
                ((char *)((long)pvVar1 + (ulong)(uVar4 & 0xff) + 0xc),
                 *(uint *)((long)pvVar1 + (ulong)(uVar4 & 0xff) + 8),elementType);
    }
    FinalizeObject((markerType *)((long)pvVar1 + 4),(char *)((long)pvVar1 + 4));
  }
  _DAT_00243efc = 0;
  ObjectBlockPool<8,_8192>::FinalizePending((ObjectBlockPool<8,_8192> *)pool8);
  ObjectBlockPool<16,_4096>::FinalizePending((ObjectBlockPool<16,_4096> *)pool16);
  ObjectBlockPool<32,_2048>::FinalizePending((ObjectBlockPool<32,_2048> *)pool32);
  ObjectBlockPool<64,_1024>::FinalizePending((ObjectBlockPool<64,_1024> *)pool64);
  ObjectBlockPool<128,_512>::FinalizePending((ObjectBlockPool<128,_512> *)pool128);
  ObjectBlockPool<256,_256>::FinalizePending((ObjectBlockPool<256,_256> *)pool256);
  ObjectBlockPool<512,_128>::FinalizePending((ObjectBlockPool<512,_128> *)pool512);
  GC::MarkPendingRoots();
  return;
}

Assistant:

void NULLC::FinalizePending()
{
	for(unsigned i = 0; i < blocksToFinalize.size(); i++)
	{
		Range &curr = blocksToFinalize[i];

		void *block = curr.start;

		markerType &marker = *(markerType*)((char*)block + 4);

		// Mark block as used
		marker |= NULLC::OBJECT_VISIBLE;

		ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

		char *base = (char*)block + 4;

		if(marker & NULLC::OBJECT_ARRAY)
		{
			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

			GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
		}
		else
		{
			GC::CheckVariable(base + sizeof(markerType), typeInfo);
		}

		NULLC::FinalizeObject(marker, (char*)block + 4);
	}

	blocksToFinalize.clear();

	pool8.FinalizePending();
	pool16.FinalizePending();
	pool32.FinalizePending();
	pool64.FinalizePending();
	pool128.FinalizePending();
	pool256.FinalizePending();
	pool512.FinalizePending();

	// Mark new roots
	GC::MarkPendingRoots();
}